

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O1

vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> * __thiscall
duckdb::PhysicalOperator::GetSources
          (vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>
           *__return_storage_ptr__,PhysicalOperator *this)

{
  pointer prVar1;
  pointer prVar2;
  int iVar3;
  const_reference pvVar4;
  InternalException *this_00;
  pointer local_58;
  iterator iStack_50;
  pointer local_48;
  undefined1 local_40 [32];
  
  local_58 = (pointer)0x0;
  iStack_50._M_current = (reference_wrapper<const_duckdb::PhysicalOperator> *)0x0;
  local_48 = (pointer)0x0;
  iVar3 = (*this->_vptr_PhysicalOperator[0x21])(this);
  if ((char)iVar3 == '\0') {
    prVar1 = (this->children).
             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    prVar2 = (this->children).
             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (prVar1 != prVar2) {
      if ((long)prVar2 - (long)prVar1 != 8) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        local_40._0_8_ = local_40 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_40,"Operator not supported in GetSource","");
        InternalException::InternalException(this_00,(string *)local_40);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar4 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                         (&this->children,0);
      (*pvVar4->_M_data->_vptr_PhysicalOperator[0x25])(__return_storage_ptr__);
      goto LAB_015f3521;
    }
    if (iStack_50._M_current != local_48) goto LAB_015f34ea;
    local_40._0_8_ = this;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator_const>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
                *)&local_58,iStack_50,(reference_wrapper<const_duckdb::PhysicalOperator> *)local_40)
    ;
  }
  else if (iStack_50._M_current == local_48) {
    local_40._0_8_ = this;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator_const>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
                *)&local_58,iStack_50,(reference_wrapper<const_duckdb::PhysicalOperator> *)local_40)
    ;
  }
  else {
LAB_015f34ea:
    (iStack_50._M_current)->_M_data = this;
    iStack_50._M_current = iStack_50._M_current + 1;
    local_40._0_8_ = this;
  }
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ).
  super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_58;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ).
  super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = iStack_50._M_current;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ).
  super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_48;
  local_58 = (pointer)0x0;
  iStack_50._M_current = (reference_wrapper<const_duckdb::PhysicalOperator> *)0x0;
  local_48 = (pointer)0x0;
LAB_015f3521:
  if (local_58 != (pointer)0x0) {
    operator_delete(local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<const_reference<PhysicalOperator>> PhysicalOperator::GetSources() const {
	vector<const_reference<PhysicalOperator>> result;
	if (IsSink()) {
		D_ASSERT(children.size() == 1);
		result.push_back(*this);
		return result;
	} else {
		if (children.empty()) {
			// source
			result.push_back(*this);
			return result;
		} else {
			if (children.size() != 1) {
				throw InternalException("Operator not supported in GetSource");
			}
			return children[0].get().GetSources();
		}
	}
}